

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O3

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::append_entries
          (raft_server *this,
          vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
          *logs)

{
  req_ext_params *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ptr<cmd_result<ptr<buffer>_>_> pVar2;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_18 = 0;
  uStack_10 = 0;
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  pVar2 = append_entries_ext(this,logs,in_RDX);
  _Var1 = pVar2.
          super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
    _Var1._M_pi = extraout_RDX;
  }
  pVar2.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  pVar2.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar2.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::append_entries
                                 ( const std::vector< ptr<buffer> >& logs )
{
    return append_entries_ext(logs, req_ext_params());
}